

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

void __thiscall
ParsedSRTTrackData::extractData(ParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  size_type __n;
  int iVar1;
  uint8_t *__dest;
  int *x;
  allocator<char> local_71;
  string postfix;
  string prefix;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  iVar1 = this->m_packetCnt;
  x = &this->m_packetCnt;
  if (iVar1 == 0) {
    std::__cxx11::string::assign((char *)&prefix);
    iVar1 = *x;
  }
  *x = iVar1 + 1;
  int32ToStr_abi_cxx11_(&postfix,x);
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::append((char *)&prefix);
  floatToTime_abi_cxx11_(&postfix,(double)pkt->pts / 5292000000.0,',');
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::append((char *)&prefix);
  floatToTime_abi_cxx11_(&postfix,(double)(pkt->duration + pkt->pts) / 5292000000.0,',');
  std::__cxx11::string::append((string *)&prefix);
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::push_back((char)&prefix);
  std::__cxx11::string::string<std::allocator<char>>((string *)&postfix,"\n\n",&local_71);
  __n = prefix._M_string_length;
  iVar1 = size + (int)prefix._M_string_length + (int)postfix._M_string_length;
  pkt->size = iVar1;
  __dest = (uint8_t *)operator_new__((long)iVar1);
  pkt->data = __dest;
  memcpy(__dest,prefix._M_dataplus._M_p,__n);
  memcpy(__dest + __n,buff,(long)size);
  memcpy(__dest + __n + size,postfix._M_dataplus._M_p,postfix._M_string_length);
  std::__cxx11::string::~string((string *)&postfix);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void ParsedSRTTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    std::string prefix;
    if (m_packetCnt == 0)
        prefix = "\xEF\xBB\xBF";  // UTF-8 header
    prefix += int32ToStr(++m_packetCnt);
    prefix += "\n";
    prefix += floatToTime(static_cast<double>(pkt->pts) / INTERNAL_PTS_FREQ, ',');
    prefix += " --> ";
    prefix += floatToTime(static_cast<double>(pkt->pts + pkt->duration) / INTERNAL_PTS_FREQ, ',');
    prefix += '\n';
    const std::string postfix = "\n\n";
    pkt->size = static_cast<int>(size + prefix.length() + postfix.length());
    pkt->data = new uint8_t[pkt->size];
    memcpy(pkt->data, prefix.c_str(), prefix.length());
    memcpy(pkt->data + prefix.length(), buff, size);
    memcpy(pkt->data + prefix.length() + size, postfix.c_str(), postfix.length());
}